

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nrand.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int output_length;
  NormalDistributedRandomValueGeneration generator;
  int seed;
  double standard_deviation;
  double mean;
  double variance;
  double random;
  ostringstream error_message;
  int local_224;
  NormalDistributedRandomValueGeneration local_220;
  int local_1e4;
  double local_1e0;
  double local_1d8;
  string local_1d0;
  double local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_224 = -1;
  local_1e4 = 1;
  local_1d8 = 0.0;
  local_1e0 = 1.0;
  iVar6 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"l:m:s:u:v:d:h",(option *)0x0,(int *)0x0);
    switch(iVar5) {
    case 0x68:
      anon_unknown.dwarf_2258::PrintUsage((ostream *)&std::cout);
      iVar6 = 0;
      iVar5 = 1;
      break;
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
switchD_00102700_caseD_69:
      anon_unknown.dwarf_2258::PrintUsage((ostream *)&std::cerr);
      goto LAB_00102b87;
    case 0x6c:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_220);
      bVar3 = sptk::ConvertStringToInteger(local_1a8,&local_224);
      bVar4 = local_224 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (!bVar3 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The argument for the -l option must be a positive integer",
                   0x39);
        local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface =
             (_func_int **)&local_220.next_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nrand","");
        sptk::PrintErrorMessage((string *)&local_220,(ostringstream *)local_1a8);
        goto LAB_00102b5c;
      }
LAB_00102a21:
      iVar5 = 0;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_220);
      bVar4 = sptk::ConvertStringToInteger(local_1a8,&local_224);
      bVar3 = -1 < local_224;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (bVar4 && bVar3) {
        local_224 = local_224 + 1;
        goto LAB_00102a21;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The argument for the -m option must be a non-negative integer",0x3d);
      local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface =
           (_func_int **)&local_220.next_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nrand","");
      sptk::PrintErrorMessage((string *)&local_220,(ostringstream *)local_1a8);
      goto LAB_00102b5c;
    case 0x73:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_220);
      bVar4 = sptk::ConvertStringToInteger(local_1a8,&local_1e4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The argument for the -s option must be an integer",0x31);
        local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface =
             (_func_int **)&local_220.next_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nrand","");
        sptk::PrintErrorMessage((string *)&local_220,(ostringstream *)local_1a8);
        goto LAB_00102b5c;
      }
LAB_00102b9f:
      iVar5 = 0;
      break;
    case 0x75:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_220);
      bVar4 = sptk::ConvertStringToDouble(local_1a8,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (bVar4) goto LAB_00102b9f;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The argument for the -u option must be numeric",0x2e);
      local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface =
           (_func_int **)&local_220.next_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nrand","");
      sptk::PrintErrorMessage((string *)&local_220,(ostringstream *)local_1a8);
      goto LAB_00102b5c;
    case 0x76:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_220);
      bVar4 = sptk::ConvertStringToDouble(local_1a8,(double *)&local_1d0);
      _Var2._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (bVar4 && 0.0 <= (double)_Var2._M_p) {
        if ((double)local_1d0._M_dataplus._M_p < 0.0) {
          local_1e0 = sqrt((double)local_1d0._M_dataplus._M_p);
        }
        else {
          local_1e0 = SQRT((double)local_1d0._M_dataplus._M_p);
        }
        goto LAB_00102b9f;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The argument for the -v option must be a non-negative number"
                 ,0x3c);
      local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface =
           (_func_int **)&local_220.next_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nrand","");
      sptk::PrintErrorMessage((string *)&local_220,(ostringstream *)local_1a8);
LAB_00102b5c:
      if (local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface !=
          (_func_int **)&local_220.next_) {
        operator_delete(local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
LAB_00102b87:
      iVar5 = 1;
      iVar6 = 1;
      break;
    default:
      if (iVar5 != -1) {
        if (iVar5 == 100) {
          std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_220);
          bVar3 = sptk::ConvertStringToDouble(local_1a8,&local_1e0);
          bVar4 = local_1e0 < 0.0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p);
          }
          if (!bVar3 || bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "The argument for the -d option must be a non-negative number",0x3c);
            local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface =
                 (_func_int **)&local_220.next_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nrand","");
            sptk::PrintErrorMessage((string *)&local_220,(ostringstream *)local_1a8);
            goto LAB_00102b5c;
          }
          goto LAB_00102a21;
        }
        goto switchD_00102700_caseD_69;
      }
      iVar5 = 2;
    }
    if (iVar5 != 0) {
      if (iVar5 == 2) {
        if (ya_optind == argc) {
          bVar4 = sptk::SetBinaryMode();
          if (bVar4) {
            sptk::NormalDistributedRandomValueGeneration::NormalDistributedRandomValueGeneration
                      (&local_220,local_1e4);
            if (local_224 != -1 && local_224 < 1) {
              return 0;
            }
            paVar1 = &local_1d0.field_2;
            iVar5 = 1;
            while( true ) {
              bVar4 = sptk::NormalDistributedRandomValueGeneration::Get(&local_220,&local_1b0);
              if (bVar4) {
                bVar4 = sptk::WriteStream<double>
                                  (local_1b0 * local_1e0 + local_1d8,(ostream *)&std::cout);
                if (!bVar4) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Failed to write random values",0x1d);
                  local_1d0._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"nrand","");
                  sptk::PrintErrorMessage(&local_1d0,(ostringstream *)local_1a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d0._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1d0._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  iVar6 = 1;
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Failed to generate random values",0x20);
                local_1d0._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"nrand","");
                sptk::PrintErrorMessage(&local_1d0,(ostringstream *)local_1a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d0._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1d0._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                iVar6 = 1;
                bVar4 = false;
              }
              if (bVar4 == false) break;
              bVar4 = local_224 <= iVar5;
              iVar5 = iVar5 + 1;
              if (local_224 != -1 && bVar4) {
                return 0;
              }
            }
            return iVar6;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Cannot set translation mode",0x1b);
          local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface =
               (_func_int **)&local_220.next_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nrand","");
          sptk::PrintErrorMessage((string *)&local_220,(ostringstream *)local_1a8);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Input file is not required",0x1a);
          local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface =
               (_func_int **)&local_220.next_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nrand","");
          sptk::PrintErrorMessage((string *)&local_220,(ostringstream *)local_1a8);
        }
        if (local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface !=
            (_func_int **)&local_220.next_) {
          operator_delete(local_220.super_RandomGenerationInterface._vptr_RandomGenerationInterface)
          ;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        iVar6 = 1;
      }
      return iVar6;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  int output_length(kMagicNumberForInfinity);
  int seed(kDefaultSeed);
  double mean(kDefaultMean);
  double standard_deviation(kDefaultStandardDeviation);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:u:v:d:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        ++output_length;
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &seed)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be an integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &mean)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be numeric";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'v': {
        double variance;
        if (!sptk::ConvertStringToDouble(optarg, &variance) || variance < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a non-negative number";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        standard_deviation = std::sqrt(variance);
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &standard_deviation) ||
            standard_deviation < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0 != argc - optind) {
    std::ostringstream error_message;
    error_message << "Input file is not required";
    sptk::PrintErrorMessage("nrand", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("nrand", error_message);
    return 1;
  }

  sptk::NormalDistributedRandomValueGeneration generator(seed);

  for (int i(0); kMagicNumberForInfinity == output_length || i < output_length;
       ++i) {
    double random;
    if (!generator.Get(&random)) {
      std::ostringstream error_message;
      error_message << "Failed to generate random values";
      sptk::PrintErrorMessage("nrand", error_message);
      return 1;
    }
    const double output(mean + random * standard_deviation);
    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write random values";
      sptk::PrintErrorMessage("nrand", error_message);
      return 1;
    }
  }

  return 0;
}